

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestacceptorFixtureprocessQueuedMessages::RunImpl
          (TestacceptorFixtureprocessQueuedMessages *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  acceptorFixtureprocessQueuedMessagesHelper fixtureHelper;
  bool ctorOk;
  TestacceptorFixtureprocessQueuedMessages *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  acceptorFixtureprocessQueuedMessagesHelper::acceptorFixtureprocessQueuedMessagesHelper
            ((acceptorFixtureprocessQueuedMessagesHelper *)local_648,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::acceptorFixtureprocessQueuedMessagesHelper>
            ((acceptorFixtureprocessQueuedMessagesHelper *)local_648,&(this->super_Test).m_details);
  acceptorFixtureprocessQueuedMessagesHelper::~acceptorFixtureprocessQueuedMessagesHelper
            ((acceptorFixtureprocessQueuedMessagesHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, processQueuedMessages)
{
  object->setResponder( this );
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 0, disconnected );

  for( int i = 3; i <= 5003; ++i )
  {
    object->next( createNewOrderSingle( "ISLD", "TW", i ), UtcTimeStamp() );
  }
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toResendRequest );
  object->next( createNewOrderSingle( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 5004, object->getExpectedTargetNum() );
  object->next( createNewOrderSingle( "ISLD", "TW", 5006 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, toResendRequest );
}